

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool input_get_scriptcode
                (wally_psbt_input *input,uint32_t input_index,uchar **script,size_t *script_len)

{
  int iVar1;
  wally_tx_output *local_68;
  size_t local_60;
  size_t p2sh_len;
  uchar p2sh [23];
  wally_tx_output *out;
  wally_tx_output *utxo;
  size_t *script_len_local;
  uchar **script_local;
  uint32_t input_index_local;
  wally_psbt_input *input_local;
  
  out = (wally_tx_output *)0x0;
  if (((input == (wally_psbt_input *)0x0) || (script == (uchar **)0x0)) ||
     (script_len == (size_t *)0x0)) {
    input_local._7_1_ = false;
  }
  else {
    *script = (uchar *)0x0;
    *script_len = 0;
    if (input->utxo != (wally_tx *)0x0) {
      if (input->utxo->num_outputs <= (ulong)input_index) {
        return false;
      }
      out = input->utxo->outputs + input_index;
    }
    if (input->witness_utxo == (wally_tx_output *)0x0) {
      local_68 = out;
    }
    else {
      local_68 = input->witness_utxo;
    }
    stack0xffffffffffffffc0 = local_68;
    if (local_68 == (wally_tx_output *)0x0) {
      input_local._7_1_ = false;
    }
    else if (input->redeem_script == (uchar *)0x0) {
      *script = local_68->script;
      *script_len = local_68->script_len;
      input_local._7_1_ = true;
    }
    else {
      iVar1 = wally_scriptpubkey_p2sh_from_bytes
                        (input->redeem_script,input->redeem_script_len,1,(uchar *)&p2sh_len,0x17,
                         &local_60);
      if (iVar1 == 0) {
        if ((stack0xffffffffffffffc0->script_len == local_60) &&
           (iVar1 = memcmp(&p2sh_len,stack0xffffffffffffffc0->script,local_60), iVar1 == 0)) {
          *script = input->redeem_script;
          *script_len = input->redeem_script_len;
          return true;
        }
        input_local._7_1_ = false;
      }
      else {
        input_local._7_1_ = false;
      }
    }
  }
  return input_local._7_1_;
}

Assistant:

static bool input_get_scriptcode(const struct wally_psbt_input *input,
                                 uint32_t input_index,
                                 const unsigned char **script,
                                 size_t *script_len)
{
    const struct wally_tx_output *utxo = NULL;
    const struct wally_tx_output *out;

    if (!input || !script || !script_len)
        return false;

    *script = NULL;
    *script_len = 0;

    if (input->utxo) {
        if (input_index >= input->utxo->num_outputs)
            return false; /* Invalid input index */
        utxo = &input->utxo->outputs[input_index];
    }

    out = input->witness_utxo ? input->witness_utxo : utxo;
    if (!out)
        return false; /* No prevout to get the script from */

    if (input->redeem_script) {
        unsigned char p2sh[WALLY_SCRIPTPUBKEY_P2SH_LEN];
        size_t p2sh_len;

        if (wally_scriptpubkey_p2sh_from_bytes(input->redeem_script,
                                               input->redeem_script_len,
                                               WALLY_SCRIPT_HASH160,
                                               p2sh, sizeof(p2sh),
                                               &p2sh_len) != WALLY_OK)
            return false;

        if (out->script_len != p2sh_len || memcmp(p2sh, out->script, p2sh_len))
            return false; /* Script mismatch */

        *script = input->redeem_script;
        *script_len = input->redeem_script_len;
        return true;
    }

    *script = out->script;
    *script_len = out->script_len;
    return true;
}